

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.c
# Opt level: O2

int inform_bin_bounds(double *series,size_t n,double *bounds,size_t m,int *binned,inform_error *err)

{
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  
  if (series != (double *)0x0) {
    if (n == 0) {
      if (err == (inform_error *)0x0) {
        return 0;
      }
      *err = INFORM_ESHORTSERIES;
      return 0;
    }
    if (bounds == (double *)0x0 || m == 0) {
      if (err == (inform_error *)0x0) {
        return 0;
      }
      *err = INFORM_EBIN;
      return 0;
    }
    iVar1 = 0;
    if (binned != (int *)0x0) {
      uVar2 = 0;
      if (0 < (int)m) {
        uVar2 = m & 0xffffffff;
      }
      sVar3 = 0;
      do {
        if (sVar3 == n) {
          return iVar1 + 1;
        }
        binned[sVar3] = (int)m;
        for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
          if (series[sVar3] <= bounds[uVar4] && bounds[uVar4] != series[sVar3]) {
            binned[sVar3] = (int)uVar4;
            goto LAB_00108394;
          }
        }
        uVar4 = m & 0xffffffff;
LAB_00108394:
        if (iVar1 <= (int)uVar4) {
          iVar1 = (int)uVar4;
        }
        sVar3 = sVar3 + 1;
      } while( true );
    }
  }
  if (err == (inform_error *)0x0) {
    return 0;
  }
  *err = INFORM_ETIMESERIES;
  return 0;
}

Assistant:

int inform_bin_bounds(double const *series, size_t n, double const *bounds,
    size_t m, int *binned, inform_error *err)
{
    if (series == NULL)
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, 0);
    else if (n == 0)
        INFORM_ERROR_RETURN(err, INFORM_ESHORTSERIES, 0);
    else if (bounds == NULL || m == 0)
        INFORM_ERROR_RETURN(err, INFORM_EBIN, 0);
    else if (binned == NULL)
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, 0);

    int b = 0;
    for (size_t i = 0; i < n; ++i)
    {
        binned[i] = (int)m;
        for (int x = 0; x < (int)m; ++x)
        {
            if (series[i] < bounds[x])
            {
                binned[i] = x;
                break;
            }
        }
        b = (b < binned[i]) ? binned[i] : b;
    }

    return b + 1;
}